

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O0

void __thiscall
gpu::shared_device_buffer::shared_device_buffer
          (shared_device_buffer *this,shared_device_buffer *other,size_t offset)

{
  size_t offset_local;
  shared_device_buffer *other_local;
  shared_device_buffer *this_local;
  
  this->buffer_ = other->buffer_;
  this->data_ = other->data_;
  this->type_ = other->type_;
  this->size_ = other->size_;
  this->offset_ = other->offset_ + offset;
  incref(this);
  return;
}

Assistant:

shared_device_buffer::shared_device_buffer(const shared_device_buffer &other, size_t offset)
{
	buffer_	= other.buffer_;
	data_	= other.data_;
	type_	= other.type_;
	size_	= other.size_;
	offset_	= other.offset_ + offset;
	incref();
}